

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_external_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_encoding cVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  byte bVar7;
  size_t __n;
  uchar *puVar6;
  byte bVar8;
  ulong uVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  size_t sStack_a0;
  char tmp [99];
  
  if (prefix == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(prefix);
    while( true ) {
      uVar2 = b->alloc;
      if (b->byte + __n < uVar2) break;
      auVar11._8_4_ = (int)(uVar2 >> 0x20);
      auVar11._0_8_ = uVar2;
      auVar11._12_4_ = 0x45300000;
      dVar13 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
      uVar9 = (ulong)dVar13;
      sVar10 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
      if (uVar2 == 0) {
        sVar10 = 0x400;
      }
      b->alloc = sVar10;
      puVar6 = (uchar *)realloc(b->data,sVar10);
      b->data = puVar6;
    }
    memcpy(b->data + b->byte,prefix,__n);
    b->byte = b->byte + __n;
  }
  cVar1 = (c->field_6).e_byte_array_len.len_encoding;
  bVar3 = (byte)cVar1;
  if (cVar1 < 0x80) {
    sStack_a0 = 1;
    tmp[0] = bVar3;
  }
  else {
    bVar7 = (byte)(cVar1 >> 8);
    if (cVar1 < 0x4000) {
      tmp[0] = bVar7 | 0x80;
      sStack_a0 = 2;
      tmp[1] = bVar3;
    }
    else {
      tmp[1] = (char)(cVar1 >> 0x10);
      if (cVar1 < 0x200000) {
        tmp[0] = tmp[1] | 0xc0;
        sStack_a0 = 3;
        tmp[1] = bVar7;
        tmp[2] = bVar3;
      }
      else {
        bVar8 = (byte)(cVar1 >> 0x18);
        if (cVar1 < 0x10000000) {
          tmp[0] = bVar8 | 0xe0;
          sStack_a0 = 4;
          tmp[2] = bVar7;
          tmp[3] = bVar3;
        }
        else {
          tmp[0] = bVar8 >> 4 | 0xf0;
          tmp[1] = (char)(cVar1 >> 0x14);
          tmp[2] = (char)(cVar1 >> 0xc);
          tmp[3] = (char)(cVar1 >> 4);
          tmp[4] = bVar3 & 0xf;
          sStack_a0 = 5;
        }
      }
    }
  }
  iVar4 = itf8_put_blk(b,c->codec);
  iVar5 = itf8_put_blk(b,(int)sStack_a0);
  while( true ) {
    uVar2 = b->alloc;
    if (b->byte + sStack_a0 < uVar2) break;
    auVar12._8_4_ = (int)(uVar2 >> 0x20);
    auVar12._0_8_ = uVar2;
    auVar12._12_4_ = 0x45300000;
    dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
    uVar9 = (ulong)dVar13;
    sVar10 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
    if (uVar2 == 0) {
      sVar10 = 0x400;
    }
    b->alloc = sVar10;
    puVar6 = (uchar *)realloc(b->data,sVar10);
    b->data = puVar6;
  }
  memcpy(b->data + b->byte,tmp,sStack_a0);
  b->byte = b->byte + sStack_a0;
  return iVar4 + iVar5 + (int)__n + (int)sStack_a0;
}

Assistant:

int cram_external_encode_store(cram_codec *c, cram_block *b, char *prefix,
			       int version) {
    char tmp[99], *tp = tmp;
    int len = 0;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tp += itf8_put(tp, c->e_external.content_id);
    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, tp-tmp);
    BLOCK_APPEND(b, tmp, tp-tmp);
    len += tp-tmp;

    return len;
}